

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

int VP8LHashChainFill(VP8LHashChain *p,int quality,uint32_t *argb,int xsize,int ysize,int low_effort
                     ,WebPPicture *pic,int percent_range,int *percent)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t *puVar6;
  uint in_ECX;
  int *in_RDX;
  int in_ESI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar7;
  WebPPicture *in_stack_00000008;
  int in_stack_00000010;
  int *in_stack_00000018;
  int curr_length_1;
  int curr_length;
  uint32_t max_base_position;
  int length_max;
  int min_pos;
  uint32_t best_argb;
  uint32_t best_distance;
  int best_length;
  int iter;
  uint32_t *argb_start;
  int max_len;
  uint32_t len;
  uint32_t tmp [2];
  int argb_comp_next;
  uint32_t hash_code;
  int32_t *chain;
  int32_t *hash_to_first_index;
  uint32_t base_position;
  int argb_comp;
  int pos;
  int percent_start;
  int remaining_percent;
  uint32_t window_size;
  int iter_max;
  int size;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int iVar8;
  int in_stack_ffffffffffffff4c;
  uint local_9c;
  uint32_t local_90;
  uint local_8c;
  uint local_88;
  int local_84;
  uint local_74;
  uint32_t local_70;
  uint local_6c;
  uint local_68;
  uint32_t local_64;
  long local_60;
  void *local_58;
  uint local_4c;
  uint local_48;
  int local_44;
  int local_40;
  int local_3c;
  uint local_38;
  int local_34;
  int local_30;
  int local_2c;
  uint local_24;
  int *local_20;
  int local_14;
  long *local_10;
  
  local_30 = in_ECX * in_R8D;
  local_2c = in_R9D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_34 = GetMaxItersForQuality(in_ESI);
  local_38 = GetWindowSizeForHashChain(local_14,local_24);
  local_3c = in_stack_00000010;
  local_40 = *in_stack_00000018;
  local_60 = *local_10;
  if (local_30 < 3) {
    *(undefined4 *)(*local_10 + (long)(local_30 + -1) * 4) = 0;
    *(undefined4 *)*local_10 = 0;
    return 1;
  }
  local_58 = WebPSafeMalloc(CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  if (local_58 == (void *)0x0) {
    iVar2 = WebPEncodingSetError(in_stack_00000008,VP8_ENC_ERROR_OUT_OF_MEMORY);
    return iVar2;
  }
  iVar2 = local_3c / 2;
  local_3c = local_3c - iVar2;
  memset(local_58,0xff,0x100000);
  local_48 = (uint)(*local_20 == local_20[1]);
  local_44 = 0;
  while (pvVar1 = local_58, local_44 < local_30 + -2) {
    local_68 = (uint)(local_20[local_44 + 1] == local_20[local_44 + 2]);
    if ((local_48 == 0) || (local_68 == 0)) {
      local_64 = GetPixPairHash64((uint32_t *)(local_20 + local_44));
      *(undefined4 *)(local_60 + (long)local_44 * 4) =
           *(undefined4 *)((long)local_58 + (ulong)local_64 * 4);
      *(int *)((long)local_58 + (ulong)local_64 * 4) = local_44;
      local_48 = local_68;
      local_44 = local_44 + 1;
    }
    else {
      local_74 = 1;
      local_70 = local_20[local_44];
      while( true ) {
        bVar7 = false;
        if ((int)(local_44 + local_74 + 2) < local_30) {
          bVar7 = local_20[local_44 + local_74 + 2] == local_20[local_44];
        }
        if (!bVar7) break;
        local_74 = local_74 + 1;
      }
      if (0xfff < local_74) {
        memset((void *)(local_60 + (long)local_44 * 4),0xff,(ulong)(local_74 - 0xfff) << 2);
        local_44 = (local_74 - 0xfff) + local_44;
        local_74 = 0xfff;
      }
      while (local_74 != 0) {
        local_6c = local_74;
        local_64 = GetPixPairHash64(&local_70);
        *(undefined4 *)(local_60 + (long)local_44 * 4) =
             *(undefined4 *)((long)local_58 + (ulong)local_64 * 4);
        *(int *)((long)local_58 + (ulong)local_64 * 4) = local_44;
        local_74 = local_74 - 1;
        local_44 = local_44 + 1;
      }
      local_48 = 0;
    }
    iVar3 = WebPReportProgress((WebPPicture *)
                               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                               in_stack_ffffffffffffff44,
                               (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
    ;
    if (iVar3 == 0) {
      WebPSafeFree((void *)0x1953a1);
      return 0;
    }
  }
  uVar4 = GetPixPairHash64((uint32_t *)(local_20 + local_44));
  *(undefined4 *)(local_60 + (long)local_44 * 4) = *(undefined4 *)((long)pvVar1 + (ulong)uVar4 * 4);
  WebPSafeFree((void *)0x195402);
  local_40 = iVar2 + local_40;
  iVar2 = WebPReportProgress((WebPPicture *)
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                             in_stack_ffffffffffffff44,
                             (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (iVar2 == 0) {
    return 0;
  }
  *(undefined4 *)(*local_10 + (long)(local_30 + -1) * 4) = 0;
  *(undefined4 *)*local_10 = 0;
  local_4c = local_30 - 2;
  do {
    if (local_4c == 0) {
      iVar2 = WebPReportProgress((WebPPicture *)
                                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                 in_stack_ffffffffffffff44,
                                 (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38
                                                ));
      return iVar2;
    }
    iVar2 = MaxFindCopyLength((local_30 + -1) - local_4c);
    local_84 = local_34;
    puVar6 = (uint32_t *)(local_20 + local_4c);
    local_88 = 0;
    local_8c = 0;
    if (local_38 < local_4c) {
      iVar3 = local_4c - local_38;
    }
    else {
      iVar3 = 0;
    }
    iVar8 = iVar2;
    if (0xff < iVar2) {
      iVar8 = 0x100;
    }
    local_44 = *(int *)(local_60 + (ulong)local_4c * 4);
    in_stack_ffffffffffffff48 = iVar8;
    in_stack_ffffffffffffff4c = iVar3;
    if (local_2c == 0) {
      if (local_24 <= local_4c) {
        uVar5 = FindMatchLength((uint32_t *)CONCAT44(iVar3,iVar8),
                                (uint32_t *)
                                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
        if (0 < (int)uVar5) {
          local_8c = local_24;
          local_88 = uVar5;
        }
        local_84 = local_84 + -1;
      }
      uVar5 = FindMatchLength((uint32_t *)
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (uint32_t *)
                              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                              in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
      if ((int)local_88 < (int)uVar5) {
        local_8c = 1;
        local_88 = uVar5;
      }
      local_84 = local_84 + -1;
      if (local_88 == 0xfff) {
        local_44 = iVar3 + -1;
      }
    }
    local_90 = puVar6[(int)local_88];
    while( true ) {
      uVar5 = in_stack_ffffffffffffff44 & 0xffffff;
      if (iVar3 <= local_44) {
        local_84 = local_84 + -1;
        uVar5 = CONCAT13(local_84 != 0,(int3)in_stack_ffffffffffffff44);
      }
      in_stack_ffffffffffffff44 = uVar5;
      if ((char)(in_stack_ffffffffffffff44 >> 0x18) == '\0') break;
      if ((local_20[(int)(local_44 + local_88)] == local_90) &&
         (uVar5 = (*VP8LVectorMismatch)((uint32_t *)(local_20 + local_44),puVar6,iVar2),
         (int)local_88 < (int)uVar5)) {
        local_8c = local_4c - local_44;
        local_90 = puVar6[(int)uVar5];
        local_88 = uVar5;
        if (iVar8 <= (int)uVar5) break;
      }
      local_44 = *(int *)(local_60 + (long)local_44 * 4);
    }
    local_9c = local_4c;
    while( true ) {
      *(uint *)(*local_10 + (ulong)local_4c * 4) = local_8c << 0xc | local_88;
      uVar5 = local_4c - 1;
      if (((((local_8c == 0) || (uVar5 == 0)) || (uVar5 < local_8c)) ||
          (local_20[uVar5 - local_8c] != local_20[uVar5])) ||
         (((local_88 == 0xfff && (local_8c != 1)) && (local_4c + 0xffe < local_9c)))) break;
      local_4c = uVar5;
      if ((int)local_88 < 0xfff) {
        local_88 = local_88 + 1;
        local_9c = uVar5;
      }
    }
    local_4c = uVar5;
    iVar2 = WebPReportProgress((WebPPicture *)
                               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                               in_stack_ffffffffffffff44,
                               (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
    ;
    if (iVar2 == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int VP8LHashChainFill(VP8LHashChain* const p, int quality,
                      const uint32_t* const argb, int xsize, int ysize,
                      int low_effort, const WebPPicture* const pic,
                      int percent_range, int* const percent) {
  const int size = xsize * ysize;
  const int iter_max = GetMaxItersForQuality(quality);
  const uint32_t window_size = GetWindowSizeForHashChain(quality, xsize);
  int remaining_percent = percent_range;
  int percent_start = *percent;
  int pos;
  int argb_comp;
  uint32_t base_position;
  int32_t* hash_to_first_index;
  // Temporarily use the p->offset_length as a hash chain.
  int32_t* chain = (int32_t*)p->offset_length;
  assert(size > 0);
  assert(p->size != 0);
  assert(p->offset_length != NULL);

  if (size <= 2) {
    p->offset_length[0] = p->offset_length[size - 1] = 0;
    return 1;
  }

  hash_to_first_index =
      (int32_t*)WebPSafeMalloc(HASH_SIZE, sizeof(*hash_to_first_index));
  if (hash_to_first_index == NULL) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }

  percent_range = remaining_percent / 2;
  remaining_percent -= percent_range;

  // Set the int32_t array to -1.
  memset(hash_to_first_index, 0xff, HASH_SIZE * sizeof(*hash_to_first_index));
  // Fill the chain linking pixels with the same hash.
  argb_comp = (argb[0] == argb[1]);
  for (pos = 0; pos < size - 2;) {
    uint32_t hash_code;
    const int argb_comp_next = (argb[pos + 1] == argb[pos + 2]);
    if (argb_comp && argb_comp_next) {
      // Consecutive pixels with the same color will share the same hash.
      // We therefore use a different hash: the color and its repetition
      // length.
      uint32_t tmp[2];
      uint32_t len = 1;
      tmp[0] = argb[pos];
      // Figure out how far the pixels are the same.
      // The last pixel has a different 64 bit hash, as its next pixel does
      // not have the same color, so we just need to get to the last pixel equal
      // to its follower.
      while (pos + (int)len + 2 < size && argb[pos + len + 2] == argb[pos]) {
        ++len;
      }
      if (len > MAX_LENGTH) {
        // Skip the pixels that match for distance=1 and length>MAX_LENGTH
        // because they are linked to their predecessor and we automatically
        // check that in the main for loop below. Skipping means setting no
        // predecessor in the chain, hence -1.
        memset(chain + pos, 0xff, (len - MAX_LENGTH) * sizeof(*chain));
        pos += len - MAX_LENGTH;
        len = MAX_LENGTH;
      }
      // Process the rest of the hash chain.
      while (len) {
        tmp[1] = len--;
        hash_code = GetPixPairHash64(tmp);
        chain[pos] = hash_to_first_index[hash_code];
        hash_to_first_index[hash_code] = pos++;
      }
      argb_comp = 0;
    } else {
      // Just move one pixel forward.
      hash_code = GetPixPairHash64(argb + pos);
      chain[pos] = hash_to_first_index[hash_code];
      hash_to_first_index[hash_code] = pos++;
      argb_comp = argb_comp_next;
    }

    if (!WebPReportProgress(
            pic, percent_start + percent_range * pos / (size - 2), percent)) {
      WebPSafeFree(hash_to_first_index);
      return 0;
    }
  }
  // Process the penultimate pixel.
  chain[pos] = hash_to_first_index[GetPixPairHash64(argb + pos)];

  WebPSafeFree(hash_to_first_index);

  percent_start += percent_range;
  if (!WebPReportProgress(pic, percent_start, percent)) return 0;
  percent_range = remaining_percent;

  // Find the best match interval at each pixel, defined by an offset to the
  // pixel and a length. The right-most pixel cannot match anything to the right
  // (hence a best length of 0) and the left-most pixel nothing to the left
  // (hence an offset of 0).
  assert(size > 2);
  p->offset_length[0] = p->offset_length[size - 1] = 0;
  for (base_position = size - 2; base_position > 0;) {
    const int max_len = MaxFindCopyLength(size - 1 - base_position);
    const uint32_t* const argb_start = argb + base_position;
    int iter = iter_max;
    int best_length = 0;
    uint32_t best_distance = 0;
    uint32_t best_argb;
    const int min_pos =
        (base_position > window_size) ? base_position - window_size : 0;
    const int length_max = (max_len < 256) ? max_len : 256;
    uint32_t max_base_position;

    pos = chain[base_position];
    if (!low_effort) {
      int curr_length;
      // Heuristic: use the comparison with the above line as an initialization.
      if (base_position >= (uint32_t)xsize) {
        curr_length = FindMatchLength(argb_start - xsize, argb_start,
                                      best_length, max_len);
        if (curr_length > best_length) {
          best_length = curr_length;
          best_distance = xsize;
        }
        --iter;
      }
      // Heuristic: compare to the previous pixel.
      curr_length =
          FindMatchLength(argb_start - 1, argb_start, best_length, max_len);
      if (curr_length > best_length) {
        best_length = curr_length;
        best_distance = 1;
      }
      --iter;
      // Skip the for loop if we already have the maximum.
      if (best_length == MAX_LENGTH) pos = min_pos - 1;
    }
    best_argb = argb_start[best_length];

    for (; pos >= min_pos && --iter; pos = chain[pos]) {
      int curr_length;
      assert(base_position > (uint32_t)pos);

      if (argb[pos + best_length] != best_argb) continue;

      curr_length = VP8LVectorMismatch(argb + pos, argb_start, max_len);
      if (best_length < curr_length) {
        best_length = curr_length;
        best_distance = base_position - pos;
        best_argb = argb_start[best_length];
        // Stop if we have reached a good enough length.
        if (best_length >= length_max) break;
      }
    }
    // We have the best match but in case the two intervals continue matching
    // to the left, we have the best matches for the left-extended pixels.
    max_base_position = base_position;
    while (1) {
      assert(best_length <= MAX_LENGTH);
      assert(best_distance <= WINDOW_SIZE);
      p->offset_length[base_position] =
          (best_distance << MAX_LENGTH_BITS) | (uint32_t)best_length;
      --base_position;
      // Stop if we don't have a match or if we are out of bounds.
      if (best_distance == 0 || base_position == 0) break;
      // Stop if we cannot extend the matching intervals to the left.
      if (base_position < best_distance ||
          argb[base_position - best_distance] != argb[base_position]) {
        break;
      }
      // Stop if we are matching at its limit because there could be a closer
      // matching interval with the same maximum length. Then again, if the
      // matching interval is as close as possible (best_distance == 1), we will
      // never find anything better so let's continue.
      if (best_length == MAX_LENGTH && best_distance != 1 &&
          base_position + MAX_LENGTH < max_base_position) {
        break;
      }
      if (best_length < MAX_LENGTH) {
        ++best_length;
        max_base_position = base_position;
      }
    }

    if (!WebPReportProgress(pic,
                            percent_start + percent_range *
                                                (size - 2 - base_position) /
                                                (size - 2),
                            percent)) {
      return 0;
    }
  }

  return WebPReportProgress(pic, percent_start + percent_range, percent);
}